

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_select_node.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan(Binder *this,BoundSelectNode *statement)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  pointer puVar2;
  long *plVar3;
  _func_int **pp_Var4;
  undefined8 uVar5;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var6;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> _Var7;
  element_type *peVar8;
  pointer pLVar9;
  pointer pLVar10;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> _Var11;
  pointer pLVar12;
  long *plVar13;
  pointer pLVar14;
  pointer pLVar15;
  reference this_00;
  pointer pEVar16;
  BoundColumnRefExpression *this_01;
  InternalException *this_02;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  ulong uVar17;
  pointer *__ptr_9;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_2;
  long lVar18;
  pointer puVar19;
  BoundQueryNode *node;
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> _Var20;
  long *plVar21;
  iterator __begin3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var22;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar23;
  ColumnBinding binding;
  templated_unique_single_t win;
  templated_unique_single_t aggregate;
  templated_unique_single_t prune;
  templated_unique_single_t proj;
  undefined1 local_d8 [32];
  _Head_base<0UL,_duckdb::LogicalAggregate_*,_false> local_b8;
  __node_base _Stack_b0;
  ClientContext *local_a8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_a0;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_98;
  _Head_base<0UL,_duckdb::LogicalProjection_*,_false> local_90;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_88;
  type local_80;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_78;
  element_type *local_70;
  element_type *local_68;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_58;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_50;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_48;
  __node_base local_40;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_38;
  
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
            ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> *)
             (in_RDX + 0x37));
  CreatePlan((Binder *)local_d8,(BoundTableRef *)statement);
  uVar5 = local_d8._0_8_;
  local_d8._0_8_ = (Expression *)0x0;
  peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
  if (peVar8 != (element_type *)0x0) {
    (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8)
    )();
  }
  if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
      local_d8._0_8_ != (Expression *)0x0) {
    (**(code **)(*(long *)local_d8._0_8_ + 8))();
  }
  if (in_RDX[0x41].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    make_uniq<duckdb::LogicalSample,duckdb::unique_ptr<duckdb::SampleOptions,std::default_delete<duckdb::SampleOptions>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
              ((duckdb *)local_d8,
               (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                *)(in_RDX + 0x41),
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)this);
    uVar5 = local_d8._0_8_;
    local_d8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if ((element_type *)local_d8._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)&(((weak_ptr<duckdb::Binder,_true> *)
                              &((BaseExpression *)local_d8._0_8_)->_vptr_BaseExpression)->internal).
                             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))();
    }
  }
  if (in_RDX[0x38].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    local_38._M_head_impl =
         in_RDX[0x38].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    in_RDX[0x38].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_40._M_nxt =
         (_Hash_node_base *)
         (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    PlanFilter((Binder *)local_d8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               statement,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_38);
    uVar5 = local_d8._0_8_;
    local_d8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    local_d8._0_8_ = (Expression *)0x0;
    if ((element_type *)local_40._M_nxt != (element_type *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)&(local_40._M_nxt)->_M_nxt
                              )->__weak_this_).internal + 8))();
    }
    local_40._M_nxt = (_Hash_node_base *)0x0;
    if (local_38._M_head_impl != (LogicalOperator *)0x0) {
      (*(local_38._M_head_impl)->_vptr_LogicalOperator[1])();
    }
    local_38._M_head_impl = (LogicalOperator *)0x0;
  }
  if ((in_RDX[0x49].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
       in_RDX[0x4a].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) &&
     (in_RDX[0x39].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
      in_RDX[0x3a].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)) {
    if (in_RDX[0x3c].
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
        in_RDX[0x3d].
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) goto LAB_00ca6acf;
    make_uniq_base<duckdb::LogicalOperator,duckdb::LogicalDummyScan,unsigned_long&>
              ((duckdb *)local_d8,(unsigned_long *)(in_RDX + 0x45));
    uVar5 = local_d8._0_8_;
    local_d8._0_8_ = (Expression *)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
    _Var20._M_head_impl = (LogicalAggregate *)local_d8._0_8_;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
      _Var20._M_head_impl = (LogicalAggregate *)local_d8._0_8_;
    }
  }
  else {
    _Var1._M_head_impl =
         in_RDX[0x3a].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    for (_Var22._M_head_impl =
              in_RDX[0x39].
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        _Var22._M_head_impl != _Var1._M_head_impl;
        _Var22._M_head_impl = (LogicalOperator *)&(_Var22._M_head_impl)->type) {
      PlanSubqueries((Binder *)statement,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)_Var22._M_head_impl,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)this);
    }
    _Var1._M_head_impl =
         in_RDX[0x4a].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    for (_Var22._M_head_impl =
              in_RDX[0x49].
              super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
              .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        _Var22._M_head_impl != _Var1._M_head_impl;
        _Var22._M_head_impl = (LogicalOperator *)&(_Var22._M_head_impl)->type) {
      PlanSubqueries((Binder *)statement,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)_Var22._M_head_impl,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)this);
    }
    peVar8 = (element_type *)operator_new(0xe0);
    _Var22._M_head_impl =
         in_RDX[0x45].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    _Var1._M_head_impl =
         in_RDX[0x47].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_d8._0_8_ =
         in_RDX[0x49].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_d8._8_8_ =
         in_RDX[0x4a].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_d8._16_8_ =
         in_RDX[0x4b].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    in_RDX[0x49].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    in_RDX[0x4a].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    in_RDX[0x4b].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    LogicalAggregate::LogicalAggregate
              ((LogicalAggregate *)peVar8,(idx_t)_Var22._M_head_impl,(idx_t)_Var1._M_head_impl,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_d8);
    local_b8._M_head_impl = (LogicalAggregate *)peVar8;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_d8);
    pLVar9 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
             ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                           *)&local_b8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)&pLVar9->groups,in_RDX + 0x39);
    _Var22._M_head_impl =
         in_RDX[0x48].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    pLVar9 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
             ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                           *)&local_b8);
    pLVar9->groupings_index = (idx_t)_Var22._M_head_impl;
    pLVar9 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
             ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                           *)&local_b8);
    ::std::
    vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
    ::_M_move_assign(&(pLVar9->grouping_sets).
                      super_vector<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ,in_RDX + 0x3c);
    pLVar9 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
             ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                           *)&local_b8);
    ::std::
    vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
    ::_M_move_assign(&(pLVar9->grouping_functions).
                      super_vector<duckdb::vector<unsigned_long,_false>,_std::allocator<duckdb::vector<unsigned_long,_false>_>_>
                     ,in_RDX + 0x4c);
    pLVar9 = unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
             ::operator->((unique_ptr<duckdb::LogicalAggregate,_std::default_delete<duckdb::LogicalAggregate>,_true>
                           *)&local_b8);
    local_48._M_head_impl =
         (LogicalOperator *)
         (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    LogicalOperator::AddChild
              (&pLVar9->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_48);
    if ((element_type *)local_48._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                              &(local_48._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                             internal + 8))();
    }
    _Var20._M_head_impl = local_b8._M_head_impl;
    local_48._M_head_impl = (LogicalOperator *)0x0;
    local_b8._M_head_impl = (LogicalAggregate *)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var20._M_head_impl;
    _Var20._M_head_impl = local_b8._M_head_impl;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
      _Var20._M_head_impl = local_b8._M_head_impl;
    }
  }
  if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)_Var20._M_head_impl !=
      (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
    (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                            &((Expression *)_Var20._M_head_impl)->super_BaseExpression)->
                           __weak_this_).internal.
                           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))();
  }
LAB_00ca6acf:
  local_98 = in_RDX;
  if (in_RDX[0x3f].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    puVar23 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
              (in_RDX + 0x3f);
    PlanSubqueries((Binder *)statement,puVar23,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)this);
    peVar8 = (element_type *)operator_new(0x80);
    local_d8._0_8_ =
         (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalFilter::LogicalFilter
              ((LogicalFilter *)peVar8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_d8);
    in_RDX = local_98;
    local_b8._M_head_impl = (LogicalAggregate *)peVar8;
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
        local_d8._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
    pLVar10 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
              operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                          *)&local_b8);
    local_50._M_head_impl =
         (LogicalOperator *)
         (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    LogicalOperator::AddChild
              (&pLVar10->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_50);
    if ((element_type *)local_50._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                              &(local_50._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                             internal + 8))();
    }
    _Var20._M_head_impl = local_b8._M_head_impl;
    local_50._M_head_impl = (LogicalOperator *)0x0;
    local_b8._M_head_impl = (LogicalAggregate *)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var20._M_head_impl;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if ((element_type *)local_b8._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((weak_ptr<duckdb::Binder,_true> *)
                              &((local_b8._M_head_impl)->super_LogicalOperator).
                               _vptr_LogicalOperator)->internal).
                             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))();
    }
  }
  if (in_RDX[0x57].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      in_RDX[0x58].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) {
    _Var11._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)operator_new(0x70);
    _Var22._M_head_impl =
         in_RDX[0x56].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    LogicalOperator::LogicalOperator
              ((LogicalOperator *)
               _Var11._M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,LOGICAL_WINDOW);
    *(undefined ***)
     _Var11._M_t.
     super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
     super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         &PTR__LogicalOperator_019b5088;
    ((LogicalOperator *)
    ((long)_Var11._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 0x68))->
    _vptr_LogicalOperator = (_func_int **)_Var22._M_head_impl;
    local_d8._0_8_ =
         _Var11._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    pLVar12 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
              operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                          *)local_d8);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      *)&(pLVar12->super_LogicalOperator).expressions,in_RDX + 0x57);
    pLVar12 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
              operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                          *)local_d8);
    puVar2 = (pLVar12->super_LogicalOperator).expressions.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar19 = (pLVar12->super_LogicalOperator).expressions.
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar2;
        puVar19 = puVar19 + 1) {
      PlanSubqueries((Binder *)statement,puVar19,
                     (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      *)this);
    }
    pLVar12 = unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>::
              operator->((unique_ptr<duckdb::LogicalWindow,_std::default_delete<duckdb::LogicalWindow>,_true>
                          *)local_d8);
    local_58._M_head_impl =
         (LogicalOperator *)
         (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    LogicalOperator::AddChild
              (&pLVar12->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_58);
    if ((element_type *)local_58._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                              &(local_58._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                             internal + 8))();
    }
    uVar5 = local_d8._0_8_;
    local_58._M_head_impl = (LogicalOperator *)0x0;
    local_d8._0_8_ = (Expression *)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
        local_d8._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
  }
  if (in_RDX[0x40].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
      (LogicalOperator *)0x0) {
    puVar23 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
              (in_RDX + 0x40);
    PlanSubqueries((Binder *)statement,puVar23,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)this);
    peVar8 = (element_type *)operator_new(0x80);
    local_d8._0_8_ =
         (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar23->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalFilter::LogicalFilter
              ((LogicalFilter *)peVar8,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_d8);
    in_RDX = local_98;
    local_b8._M_head_impl = (LogicalAggregate *)peVar8;
    if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
        local_d8._0_8_ != (Expression *)0x0) {
      (**(code **)(*(long *)local_d8._0_8_ + 8))();
    }
    pLVar10 = unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>::
              operator->((unique_ptr<duckdb::LogicalFilter,_std::default_delete<duckdb::LogicalFilter>,_true>
                          *)&local_b8);
    local_60._M_head_impl =
         (LogicalOperator *)
         (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    LogicalOperator::AddChild
              (&pLVar10->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_60);
    if ((element_type *)local_60._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                              &(local_60._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                             internal + 8))();
    }
    _Var20._M_head_impl = local_b8._M_head_impl;
    local_60._M_head_impl = (LogicalOperator *)0x0;
    local_b8._M_head_impl = (LogicalAggregate *)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var20._M_head_impl;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if ((element_type *)local_b8._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((weak_ptr<duckdb::Binder,_true> *)
                              &((local_b8._M_head_impl)->super_LogicalOperator).
                               _vptr_LogicalOperator)->internal).
                             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2> + 8))();
    }
  }
  _Var22._M_head_impl =
       in_RDX[0x5d].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  if (_Var22._M_head_impl != (LogicalOperator *)0x0) {
    local_80 = (type)&PTR__LogicalOperator_019b4fd0;
    do {
      _Var22._M_head_impl = (LogicalOperator *)&_Var22._M_head_impl[-1].field_0x67;
      _Var1._M_head_impl =
           in_RDX[0x5b].
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      uVar17 = (ulong)_Var22._M_head_impl % (ulong)_Var1._M_head_impl;
      plVar3 = (long *)(&(in_RDX[0x5a].
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl)->
                         _vptr_LogicalOperator)[uVar17];
      plVar13 = (long *)0x0;
      if ((plVar3 != (long *)0x0) &&
         (plVar13 = plVar3, plVar21 = (long *)*plVar3,
         _Var22._M_head_impl != (LogicalOperator *)((long *)*plVar3)[1])) {
        while (plVar3 = (long *)*plVar21, plVar3 != (long *)0x0) {
          plVar13 = (long *)0x0;
          if (((ulong)plVar3[1] % (ulong)_Var1._M_head_impl != uVar17) ||
             (plVar13 = plVar21, plVar21 = plVar3,
             _Var22._M_head_impl == (LogicalOperator *)plVar3[1])) goto LAB_00ca6dec;
        }
        plVar13 = (long *)0x0;
      }
LAB_00ca6dec:
      if (plVar13 == (long *)0x0) {
        lVar18 = 0;
      }
      else {
        lVar18 = *plVar13;
      }
      if (lVar18 == 0) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        local_d8._0_8_ = (long)local_d8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_d8,"unnests specified at level %d but none were found","");
        InternalException::InternalException<unsigned_long>
                  (this_02,(string *)local_d8,(unsigned_long)_Var22._M_head_impl);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      _Var11._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)operator_new(0x70)
      ;
      pp_Var4 = *(_func_int ***)(lVar18 + 0x10);
      LogicalOperator::LogicalOperator
                ((LogicalOperator *)
                 _Var11._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl,LOGICAL_UNNEST);
      *(type *)_Var11._M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_80;
      ((LogicalOperator *)
      ((long)_Var11._M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 0x68))->
      _vptr_LogicalOperator = pp_Var4;
      local_d8._0_8_ =
           _Var11._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      pLVar14 = unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>
                ::operator->((unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>
                              *)local_d8);
      in_RDX = local_98;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::_M_move_assign((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        *)&(pLVar14->super_LogicalOperator).expressions,lVar18 + 0x18);
      pLVar14 = unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>
                ::operator->((unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>
                              *)local_d8);
      puVar2 = (pLVar14->super_LogicalOperator).expressions.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar19 = (pLVar14->super_LogicalOperator).expressions.
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar19 != puVar2;
          puVar19 = puVar19 + 1) {
        PlanSubqueries((Binder *)statement,puVar19,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)this);
      }
      pLVar14 = unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>
                ::operator->((unique_ptr<duckdb::LogicalUnnest,_std::default_delete<duckdb::LogicalUnnest>,_true>
                              *)local_d8);
      local_88._M_head_impl =
           (LogicalOperator *)
           (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      LogicalOperator::AddChild
                (&pLVar14->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_88);
      if ((element_type *)local_88._M_head_impl != (element_type *)0x0) {
        (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                                &(local_88._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                               internal + 8))();
      }
      uVar5 = local_d8._0_8_;
      local_88._M_head_impl = (LogicalOperator *)0x0;
      local_d8._0_8_ = (Expression *)0x0;
      peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
               super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
      super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
      if (peVar8 != (element_type *)0x0) {
        (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_
                    + 8))();
      }
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_d8._0_8_ != (Expression *)0x0) {
        (**(code **)(*(long *)local_d8._0_8_ + 8))();
      }
    } while (_Var22._M_head_impl != (LogicalOperator *)0x0);
  }
  _Var1._M_head_impl =
       in_RDX[0x35].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  for (_Var22._M_head_impl =
            in_RDX[0x34].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      _Var22._M_head_impl != _Var1._M_head_impl;
      _Var22._M_head_impl = (LogicalOperator *)&(_Var22._M_head_impl)->type) {
    PlanSubqueries((Binder *)statement,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   _Var22._M_head_impl,
                   (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)this);
  }
  peVar8 = (element_type *)operator_new(0x70);
  _Var22._M_head_impl =
       in_RDX[0x44].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_d8._0_8_ =
       in_RDX[0x34].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_d8._8_8_ =
       in_RDX[0x35].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  local_d8._16_8_ =
       in_RDX[0x36].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  in_RDX[0x34].
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  in_RDX[0x35].
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  in_RDX[0x36].
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  LogicalProjection::LogicalProjection
            ((LogicalProjection *)peVar8,(idx_t)_Var22._M_head_impl,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)local_d8);
  local_90._M_head_impl = (LogicalProjection *)peVar8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)local_d8);
  local_80 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
             ::operator*((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                          *)&local_90);
  pLVar15 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
            ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                          *)&local_90);
  local_68 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  node = (BoundQueryNode *)&local_68;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  LogicalOperator::AddChild
            (&pLVar15->super_LogicalOperator,
             (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)node);
  if (local_68 != (element_type *)0x0) {
    (**(code **)(*(long *)&(local_68->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                8))();
  }
  _Var7._M_head_impl = local_90._M_head_impl;
  local_68 = (element_type *)0x0;
  local_90._M_head_impl = (LogicalProjection *)0x0;
  peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var7._M_head_impl;
  if (peVar8 != (element_type *)0x0) {
    (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8)
    )();
  }
  local_70 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  VisitQueryNode((Binder *)local_d8,node,in_RDX);
  uVar5 = local_d8._0_8_;
  local_d8._0_8_ = (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
           super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar5;
  if (peVar8 != (element_type *)0x0) {
    (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ + 8)
    )();
  }
  local_d8._0_8_ =
       (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
  if (local_70 != (element_type *)0x0) {
    (**(code **)(*(long *)&(local_70->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                8))();
  }
  local_70 = (element_type *)0x0;
  if (*(char *)&in_RDX[0x62].
                super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl == '\x01') {
    local_b8._M_head_impl = (LogicalAggregate *)0x0;
    _Stack_b0._M_nxt = (_Hash_node_base *)0x0;
    local_a8 = (ClientContext *)0x0;
    if (in_RDX[0x42].
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      local_80 = (type)&(local_80->super_LogicalOperator).expressions;
      uVar17 = 0;
      do {
        this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                                *)local_80,uVar17);
        pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(this_00);
        _Var22._M_head_impl =
             local_98[0x44].
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        this_01 = (BoundColumnRefExpression *)operator_new(0x70);
        LogicalType::LogicalType((LogicalType *)local_d8,&pEVar16->return_type);
        binding.column_index = uVar17;
        binding.table_index = (idx_t)_Var22._M_head_impl;
        BoundColumnRefExpression::BoundColumnRefExpression
                  (this_01,(LogicalType *)local_d8,binding,0);
        LogicalType::~LogicalType((LogicalType *)local_d8);
        local_a0._M_head_impl = (Expression *)this_01;
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_b8,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_a0);
        if ((BoundColumnRefExpression *)local_a0._M_head_impl != (BoundColumnRefExpression *)0x0) {
          (*(((Expression *)&(local_a0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 < local_98[0x42].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
    }
    peVar8 = (element_type *)operator_new(0x70);
    local_d8._0_8_ = local_b8._M_head_impl;
    local_d8._8_8_ = _Stack_b0._M_nxt;
    local_d8._16_8_ = local_a8;
    local_b8._M_head_impl = (LogicalAggregate *)0x0;
    _Stack_b0._M_nxt = (_Hash_node_base *)0x0;
    local_a8 = (ClientContext *)0x0;
    LogicalProjection::LogicalProjection
              ((LogicalProjection *)peVar8,
               (idx_t)local_98[0x61].
                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
               (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)local_d8);
    local_a0._M_head_impl = (Expression *)peVar8;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)local_d8);
    pLVar15 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
              ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                            *)&local_a0);
    local_78._M_head_impl =
         (LogicalOperator *)
         (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
         super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    LogicalOperator::AddChild
              (&pLVar15->super_LogicalOperator,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&local_78);
    if ((element_type *)local_78._M_head_impl != (element_type *)0x0) {
      (**(code **)(*(long *)&(((enable_shared_from_this<duckdb::Binder> *)
                              &(local_78._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).
                             internal + 8))();
    }
    _Var6._M_head_impl = local_a0._M_head_impl;
    local_78._M_head_impl = (LogicalOperator *)0x0;
    local_a0._M_head_impl = (Expression *)0x0;
    peVar8 = (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
             super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var6._M_head_impl;
    if (peVar8 != (element_type *)0x0) {
      (**(code **)(*(long *)&(peVar8->super_enable_shared_from_this<duckdb::Binder>).__weak_this_ +
                  8))();
    }
    if ((BoundColumnRefExpression *)local_a0._M_head_impl != (BoundColumnRefExpression *)0x0) {
      (*(((Expression *)&(local_a0._M_head_impl)->super_BaseExpression)->super_BaseExpression).
        _vptr_BaseExpression[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_b8);
  }
  if (local_90._M_head_impl != (LogicalProjection *)0x0) {
    (*(code *)((_Hash_node_base *)
              ((local_90._M_head_impl)->super_LogicalOperator)._vptr_LogicalOperator)[1]._M_nxt)();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundSelectNode &statement) {
	unique_ptr<LogicalOperator> root;
	D_ASSERT(statement.from_table);
	root = CreatePlan(*statement.from_table);
	D_ASSERT(root);

	// plan the sample clause
	if (statement.sample_options) {
		root = make_uniq<LogicalSample>(std::move(statement.sample_options), std::move(root));
	}

	if (statement.where_clause) {
		root = PlanFilter(std::move(statement.where_clause), std::move(root));
	}

	if (!statement.aggregates.empty() || !statement.groups.group_expressions.empty()) {
		if (!statement.groups.group_expressions.empty()) {
			// visit the groups
			for (auto &group : statement.groups.group_expressions) {
				PlanSubqueries(group, root);
			}
		}
		// now visit all aggregate expressions
		for (auto &expr : statement.aggregates) {
			PlanSubqueries(expr, root);
		}
		// finally create the aggregate node with the group_index and aggregate_index as obtained from the binder
		auto aggregate = make_uniq<LogicalAggregate>(statement.group_index, statement.aggregate_index,
		                                             std::move(statement.aggregates));
		aggregate->groups = std::move(statement.groups.group_expressions);
		aggregate->groupings_index = statement.groupings_index;
		aggregate->grouping_sets = std::move(statement.groups.grouping_sets);
		aggregate->grouping_functions = std::move(statement.grouping_functions);

		aggregate->AddChild(std::move(root));
		root = std::move(aggregate);
	} else if (!statement.groups.grouping_sets.empty()) {
		// edge case: we have grouping sets but no groups or aggregates
		// this can only happen if we have e.g. select 1 from tbl group by ();
		// just output a dummy scan
		root = make_uniq_base<LogicalOperator, LogicalDummyScan>(statement.group_index);
	}

	if (statement.having) {
		PlanSubqueries(statement.having, root);
		auto having = make_uniq<LogicalFilter>(std::move(statement.having));

		having->AddChild(std::move(root));
		root = std::move(having);
	}

	if (!statement.windows.empty()) {
		auto win = make_uniq<LogicalWindow>(statement.window_index);
		win->expressions = std::move(statement.windows);
		// visit the window expressions
		for (auto &expr : win->expressions) {
			PlanSubqueries(expr, root);
		}
		D_ASSERT(!win->expressions.empty());
		win->AddChild(std::move(root));
		root = std::move(win);
	}

	if (statement.qualify) {
		PlanSubqueries(statement.qualify, root);
		auto qualify = make_uniq<LogicalFilter>(std::move(statement.qualify));

		qualify->AddChild(std::move(root));
		root = std::move(qualify);
	}

	for (idx_t i = statement.unnests.size(); i > 0; i--) {
		auto unnest_level = i - 1;
		auto entry = statement.unnests.find(unnest_level);
		if (entry == statement.unnests.end()) {
			throw InternalException("unnests specified at level %d but none were found", unnest_level);
		}
		auto &unnest_node = entry->second;
		auto unnest = make_uniq<LogicalUnnest>(unnest_node.index);
		unnest->expressions = std::move(unnest_node.expressions);
		// visit the unnest expressions
		for (auto &expr : unnest->expressions) {
			PlanSubqueries(expr, root);
		}
		D_ASSERT(!unnest->expressions.empty());
		unnest->AddChild(std::move(root));
		root = std::move(unnest);
	}

	for (auto &expr : statement.select_list) {
		PlanSubqueries(expr, root);
	}

	auto proj = make_uniq<LogicalProjection>(statement.projection_index, std::move(statement.select_list));
	auto &projection = *proj;
	proj->AddChild(std::move(root));
	root = std::move(proj);

	// finish the plan by handling the elements of the QueryNode
	root = VisitQueryNode(statement, std::move(root));

	// add a prune node if necessary
	if (statement.need_prune) {
		D_ASSERT(root);
		vector<unique_ptr<Expression>> prune_expressions;
		for (idx_t i = 0; i < statement.column_count; i++) {
			prune_expressions.push_back(make_uniq<BoundColumnRefExpression>(
			    projection.expressions[i]->return_type, ColumnBinding(statement.projection_index, i)));
		}
		auto prune = make_uniq<LogicalProjection>(statement.prune_index, std::move(prune_expressions));
		prune->AddChild(std::move(root));
		root = std::move(prune);
	}
	return root;
}